

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Graph::findChildProcessor<soul::Identifier>
          (Graph *this,Identifier *processorInstanceName)

{
  bool bVar1;
  reference this_00;
  ProcessorInstance *pPVar2;
  UnqualifiedName *pUVar3;
  Identifier *in_RDX;
  pool_ref<soul::AST::ProcessorInstance> *i;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
  *__range3;
  Identifier *processorInstanceName_local;
  Graph *this_local;
  
  __end3 = std::
           vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ::begin((vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
                    *)(processorInstanceName + 0x26));
  i = (pool_ref<soul::AST::ProcessorInstance> *)
      std::
      vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
      ::end((vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
             *)(processorInstanceName + 0x26));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
                                *)&i);
    if (!bVar1) {
      pool_ptr<soul::AST::ProcessorInstance>::pool_ptr
                ((pool_ptr<soul::AST::ProcessorInstance> *)this);
      return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
              ::operator*(&__end3);
    pPVar2 = pool_ref<soul::AST::ProcessorInstance>::operator->(this_00);
    pUVar3 = pool_ptr<soul::AST::UnqualifiedName>::operator->(&pPVar2->instanceName);
    bVar1 = Identifier::operator==(&pUVar3->identifier,in_RDX);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::AST::ProcessorInstance>_*,_std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>_>
    ::operator++(&__end3);
  }
  pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
  return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<ProcessorInstance> findChildProcessor (const StringType& processorInstanceName) const
        {
            for (auto& i : processorInstances)
                if (i->instanceName->identifier == processorInstanceName)
                    return i;

            return {};
        }